

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathNewValueTree(xmlNodePtr val)

{
  xmlNodeSetPtr pxVar1;
  xmlXPathObjectPtr ret;
  xmlNodePtr val_local;
  
  val_local = (xmlNodePtr)(*xmlMalloc)(0x48);
  if (val_local == (xmlNodePtr)0x0) {
    xmlXPathErrMemory((xmlXPathContextPtr)0x0,"creating result value tree\n");
    val_local = (xmlNodePtr)0x0;
  }
  else {
    memset(val_local,0,0x48);
    *(undefined4 *)&val_local->_private = 9;
    *(undefined4 *)&val_local->name = 1;
    val_local->parent = val;
    pxVar1 = xmlXPathNodeSetCreate(val);
    *(xmlNodeSetPtr *)&val_local->type = pxVar1;
  }
  return (xmlXPathObjectPtr)val_local;
}

Assistant:

xmlXPathObjectPtr
xmlXPathNewValueTree(xmlNodePtr val) {
    xmlXPathObjectPtr ret;

    ret = (xmlXPathObjectPtr) xmlMalloc(sizeof(xmlXPathObject));
    if (ret == NULL) {
        xmlXPathErrMemory(NULL, "creating result value tree\n");
	return(NULL);
    }
    memset(ret, 0 , (size_t) sizeof(xmlXPathObject));
    ret->type = XPATH_XSLT_TREE;
    ret->boolval = 1;
    ret->user = (void *) val;
    ret->nodesetval = xmlXPathNodeSetCreate(val);
#ifdef XP_DEBUG_OBJ_USAGE
    xmlXPathDebugObjUsageRequested(NULL, XPATH_XSLT_TREE);
#endif
    return(ret);
}